

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::glog_internal_namespace_::InitGoogleLoggingUtilities(char *argv0)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_78;
  LogMessageVoidify local_11;
  char *local_10;
  char *argv0_local;
  
  local_10 = argv0;
  bVar1 = IsGoogleLoggingInitialized();
  if (!bVar1) {
    g_program_invocation_short_name = const_basename(local_10);
    InstallFailureFunction(DumpStackTraceAndExit);
    return;
  }
  LogMessageVoidify::LogMessageVoidify(&local_11);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/utilities.cc"
             ,0x12e);
  poVar2 = LogMessage::stream(&local_78);
  poVar2 = std::operator<<(poVar2,"Check failed: !IsGoogleLoggingInitialized() ");
  poVar2 = std::operator<<(poVar2,"You called InitGoogleLogging() twice!");
  LogMessageVoidify::operator&(&local_11,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

void InitGoogleLoggingUtilities(const char* argv0) {
  CHECK(!IsGoogleLoggingInitialized())
      << "You called InitGoogleLogging() twice!";
  g_program_invocation_short_name = const_basename(argv0);

#ifdef HAVE_STACKTRACE
  InstallFailureFunction(&DumpStackTraceAndExit);
#endif
}